

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O3

void __thiscall djb::fresnel::sgd::sgd(sgd *this,vec3 *f0,vec3 *f1)

{
  float *pfVar1;
  float_t fVar2;
  float *pfVar3;
  
  (this->super_impl)._vptr_impl = (_func_int **)&PTR_clone_001fbcc8;
  (this->f0)._M_size = 0;
  (this->f0)._M_data = (float *)0x0;
  (this->f1)._M_size = 0;
  (this->f1)._M_data = (float *)0x0;
  pfVar3 = (float *)operator_new(0xc);
  pfVar3[2] = f0->z;
  fVar2 = f0->y;
  pfVar3[0] = f0->x;
  pfVar3[1] = fVar2;
  pfVar1 = (this->f0)._M_data;
  if (pfVar1 != (float *)0x0) {
    operator_delete(pfVar1);
  }
  (this->f0)._M_size = 3;
  (this->f0)._M_data = pfVar3;
  operator_delete((void *)0x0);
  pfVar3 = (float *)operator_new(0xc);
  pfVar3[2] = f1->z;
  fVar2 = f1->y;
  pfVar3[0] = f1->x;
  pfVar3[1] = fVar2;
  pfVar1 = (this->f1)._M_data;
  if (pfVar1 != (float *)0x0) {
    operator_delete(pfVar1);
  }
  (this->f1)._M_size = 3;
  (this->f1)._M_data = pfVar3;
  operator_delete((void *)0x0);
  return;
}

Assistant:

sgd::sgd(const vec3 &f0, const vec3 &f1)
{
	this->f0 = brdf::value_type(&f0.x, 3);
	this->f1 = brdf::value_type(&f1.x, 3);
}